

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_value_function.cpp
# Opt level: O1

void __thiscall
duckdb::WindowLeadLagLocalState::WindowLeadLagLocalState
          (WindowLeadLagLocalState *this,WindowLeadLagGlobalState *gstate)

{
  _Head_base<0UL,_duckdb::WindowAggregatorState_*,_false> _Var1;
  _Head_base<0UL,_duckdb::WindowAggregatorState_*,_false> _Var2;
  WindowAggregatorState *in_RAX;
  pointer pWVar3;
  pointer *__ptr;
  _Head_base<0UL,_duckdb::WindowAggregatorState_*,_false> local_18;
  
  local_18._M_head_impl = in_RAX;
  WindowValueLocalState::WindowValueLocalState
            (&this->super_WindowValueLocalState,&gstate->super_WindowValueGlobalState);
  (this->super_WindowValueLocalState).super_WindowExecutorBoundsState.super_WindowExecutorLocalState
  .super_WindowExecutorState._vptr_WindowExecutorState =
       (_func_int **)&PTR__WindowLeadLagLocalState_019cc488;
  (this->local_row).
  super_unique_ptr<duckdb::WindowAggregatorState,_std::default_delete<duckdb::WindowAggregatorState>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::WindowAggregatorState,_std::default_delete<duckdb::WindowAggregatorState>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::WindowAggregatorState_*,_std::default_delete<duckdb::WindowAggregatorState>_>
  .super__Head_base<0UL,_duckdb::WindowAggregatorState_*,_false>._M_head_impl =
       (WindowAggregatorState *)0x0;
  if ((gstate->row_tree).
      super_unique_ptr<duckdb::WindowTokenTree,_std::default_delete<duckdb::WindowTokenTree>_>._M_t.
      super___uniq_ptr_impl<duckdb::WindowTokenTree,_std::default_delete<duckdb::WindowTokenTree>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::WindowTokenTree_*,_std::default_delete<duckdb::WindowTokenTree>_>
      .super__Head_base<0UL,_duckdb::WindowTokenTree_*,_false>._M_head_impl !=
      (WindowTokenTree *)0x0) {
    pWVar3 = unique_ptr<duckdb::WindowTokenTree,_std::default_delete<duckdb::WindowTokenTree>,_true>
             ::operator->(&gstate->row_tree);
    (*(pWVar3->super_WindowMergeSortTree)._vptr_WindowMergeSortTree[2])(&local_18,pWVar3);
    _Var2._M_head_impl = local_18._M_head_impl;
    local_18._M_head_impl = (WindowAggregatorState *)0x0;
    _Var1._M_head_impl =
         (this->local_row).
         super_unique_ptr<duckdb::WindowAggregatorState,_std::default_delete<duckdb::WindowAggregatorState>_>
         ._M_t.
         super___uniq_ptr_impl<duckdb::WindowAggregatorState,_std::default_delete<duckdb::WindowAggregatorState>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::WindowAggregatorState_*,_std::default_delete<duckdb::WindowAggregatorState>_>
         .super__Head_base<0UL,_duckdb::WindowAggregatorState_*,_false>._M_head_impl;
    (this->local_row).
    super_unique_ptr<duckdb::WindowAggregatorState,_std::default_delete<duckdb::WindowAggregatorState>_>
    ._M_t.
    super___uniq_ptr_impl<duckdb::WindowAggregatorState,_std::default_delete<duckdb::WindowAggregatorState>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::WindowAggregatorState_*,_std::default_delete<duckdb::WindowAggregatorState>_>
    .super__Head_base<0UL,_duckdb::WindowAggregatorState_*,_false>._M_head_impl = _Var2._M_head_impl
    ;
    if (_Var1._M_head_impl != (WindowAggregatorState *)0x0) {
      (**(code **)((long)(_Var1._M_head_impl)->_vptr_WindowAggregatorState + 8))();
    }
    if (local_18._M_head_impl != (WindowAggregatorState *)0x0) {
      (*(local_18._M_head_impl)->_vptr_WindowAggregatorState[1])();
    }
  }
  return;
}

Assistant:

explicit WindowLeadLagLocalState(const WindowLeadLagGlobalState &gstate) : WindowValueLocalState(gstate) {
		if (gstate.row_tree) {
			local_row = gstate.row_tree->GetLocalState();
		}
	}